

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucs.h
# Opt level: O0

unsigned_short MeCab::utf16le_to_ucs2(char *begin,char *end,size_t *mblen)

{
  size_t len;
  size_t *mblen_local;
  char *end_local;
  char *begin_local;
  ushort local_2;
  
  if ((ulong)((long)end - (long)begin) < 2) {
    *mblen = 1;
    local_2 = 0;
  }
  else {
    *mblen = 2;
    local_2 = (short)*begin << 8 | (short)begin[1];
  }
  return local_2;
}

Assistant:

inline unsigned short utf16le_to_ucs2(const char *begin, const char *end,
                                      size_t *mblen) {
  const size_t len = end - begin;
  if (len <= 1) {
    *mblen = 1;
    return 0;
  }
  *mblen = 2;
#if defined WORDS_BIGENDIAN
  return (begin[1] << 8 | begin[0]);
#else
  return (begin[0] << 8 | begin[1]);
#endif
}